

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O2

int anon_unknown.dwarf_19796::RtMidiOut_getcurrentapi(lua_State *L)

{
  Api AVar1;
  RtMidiOut *this;
  
  this = getRtMidiOut(L,1);
  AVar1 = RtMidiOut::getCurrentApi(this);
  lua_pushinteger(L,AVar1);
  return 1;
}

Assistant:

int RtMidiOut_getcurrentapi(lua_State *L) {
	auto &self = getRtMidiOut(L, 1);
	lua_pushinteger(L, self.getCurrentApi());
	return 1;
}